

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_insert(HSQUIRRELVM v)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *pSVar3;
  SQTable *err;
  SQObject *in_stack_00000008;
  SQObject *val;
  SQObject *idx;
  SQObject *o;
  SQInteger in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  HSQUIRRELVM v_00;
  SQRESULT local_8;
  
  pSVar2 = stack_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pSVar3 = stack_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  stack_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  v_00 = (HSQUIRRELVM)(pSVar2->super_SQObject)._unVal.pTable;
  if ((pSVar3->super_SQObject)._type == OT_FLOAT) {
    err = (SQTable *)(long)(pSVar3->super_SQObject)._unVal.fFloat;
  }
  else {
    err = (pSVar3->super_SQObject)._unVal.pTable;
  }
  bVar1 = SQArray::Insert((SQArray *)idx,(SQInteger)val,in_stack_00000008);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    local_8 = sq_throwerror(v_00,(SQChar *)err);
  }
  return local_8;
}

Assistant:

static SQInteger array_insert(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    SQObject &idx=stack_get(v,2);
    SQObject &val=stack_get(v,3);
    if(!_array(o)->Insert(tointeger(idx),val))
        return sq_throwerror(v,_SC("index out of range"));
    return 0;
}